

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qr.c
# Opt level: O3

void qrPower(word *c,word *a,word *b,size_t m,qr_o *r,void *stack)

{
  word *b_00;
  word *pwVar1;
  byte bVar2;
  size_t sVar3;
  bool_t bVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  size_t width;
  
  uVar5 = m << 6;
  uVar9 = 3;
  if (((0x4f < uVar5) && (uVar9 = 4, 0xef < uVar5)) && (uVar9 = 5, 0x29f < uVar5)) {
    uVar9 = 7 - (ulong)(uVar5 < 0x700);
  }
  bVar2 = (char)uVar9 - 1;
  sVar7 = r->n;
  bVar4 = wwIsZero(b,m);
  if (bVar4 == 0) {
    b_00 = (word *)((long)stack + sVar7 * 8);
    pwVar1 = b_00 + (sVar7 << (bVar2 & 0x3f));
    (*r->sqr)(b_00,a,r,pwVar1);
    (*r->mul)(b_00 + r->n,a,b_00,r,pwVar1);
    uVar5 = 3;
    do {
      (*r->mul)(b_00 + (uVar5 - 1) * r->n,b_00 + (uVar5 - 1) * r->n + -r->n,b_00,r,pwVar1);
      uVar6 = uVar5 >> (bVar2 & 0x3f);
      uVar5 = uVar5 + 1;
    } while (uVar6 == 0);
    wwCopy(b_00,a,r->n);
    sVar7 = wwBitSize(b,m);
    uVar5 = uVar9;
    if (sVar7 < uVar9) {
      uVar5 = sVar7;
    }
    uVar8 = wwGetBits(b,sVar7 - uVar5,uVar5);
    uVar6 = uVar8 & 1;
    while (uVar6 == 0) {
      uVar5 = uVar5 - 1;
      uVar6 = uVar8 & 2;
      uVar8 = uVar8 >> 1;
    }
    wwCopy((word *)stack,b_00 + (uVar8 >> 1) * r->n,r->n);
    sVar7 = sVar7 + ~uVar5;
    while (sVar7 != 0xffffffffffffffff) {
      bVar4 = wwTestBit(b,sVar7);
      if (bVar4 == 0) {
        (*r->sqr)((word *)stack,(word *)stack,r,pwVar1);
        sVar7 = sVar7 - 1;
      }
      else {
        uVar5 = sVar7 + 1;
        width = uVar9;
        if (uVar5 < uVar9) {
          width = uVar5;
        }
        uVar6 = wwGetBits(b,uVar5 - width,width);
        uVar5 = uVar6 & 1;
        while (sVar3 = width, uVar5 == 0) {
          width = width - 1;
          uVar5 = uVar6 & 2;
          uVar6 = uVar6 >> 1;
        }
        for (; sVar3 != 0; sVar3 = sVar3 - 1) {
          (*r->sqr)((word *)stack,(word *)stack,r,pwVar1);
        }
        sVar7 = sVar7 - width;
        (*r->mul)((word *)stack,(word *)stack,b_00 + (uVar6 >> 1) * r->n,r,pwVar1);
      }
    }
  }
  else {
    stack = r->unity;
  }
  wwCopy(c,(word *)stack,r->n);
  return;
}

Assistant:

void qrPower(word c[], const word a[], const word b[], size_t m, 
	const qr_o* r, void* stack)
{
	const size_t w = qrCalcSlideWidth(m);
	const size_t powers_count = SIZE_1 << (w - 1);
	register word slide;
	register size_t slide_size;
	size_t pos;
	// переменные в stack
	word* power;
	word* powers;
	// pre
	ASSERT(qrIsOperable(r));
	ASSERT(wwIsValid(a, r->n));
	ASSERT(wwIsValid(b, m));
	ASSERT(wwIsValid(c, r->n));
	// раскладка stack
	power = (word*)stack;
	powers = power + r->n;
	stack = powers + r->n * powers_count;
	// b == 0? => с <- unity
	if (wwIsZero(b, m))
	{
		wwCopy(c, r->unity, r->n);
		return;
	}
	// расчет малых степеней a
	ASSERT(w > 0);
	if (w == 1)
		wwCopy(powers, a, r->n);
	else
	{
		size_t i;
		// powers[0] <- a^2
		qrSqr(powers, a, r, stack);
		// powers[1] <- a^3
		qrMul(powers + r->n, a, powers, r, stack);
		// powers[i] <- a^{2i + 1} = powers[i - 1] * powers[0]
		for (i = 2; i < powers_count; ++i)
			qrMul(powers + r->n * i, powers + r->n * i - r->n, powers, r, 
				stack);
		// powers[0] <- a
		wwCopy(powers, a, r->n);
	}
	// pos <- l - 1
	pos = wwBitSize(b, m) - 1;
	ASSERT(pos != SIZE_MAX);
	// slide <- старший слайд b
	slide_size = MIN2(pos + 1, w);
	slide = wwGetBits(b, pos - slide_size + 1, slide_size);
	while (slide % 2 == 0)
		slide >>= 1, slide_size--;
	// power <- powers[slide / 2]
	wwCopy(power, powers + r->n * (slide / 2), r->n);
	pos -= slide_size;
	// пробегаем биты b
	while (pos != SIZE_MAX)
		if (!wwTestBit(b, pos))
		{
			// power <- power^2
			qrSqr(power, power, r, stack);
			--pos;
		}
		else
		{
			// slide <- очередной слайд b
			slide_size = MIN2(pos + 1, w);
			slide = wwGetBits(b, pos - slide_size + 1, slide_size);
			while (slide % 2 == 0)
				slide >>= 1, slide_size--;
			pos -= slide_size;
			// power <- power^2
			while (slide_size--)
				qrSqr(power, power, r, stack);
			// power <- power * powers[slide / 2]
			qrMul(power, power, powers + r->n * (slide / 2), r, stack);
		}
	// очистка и возврат
	slide_size = 0, slide = 0;
	wwCopy(c, power, r->n);
}